

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__add_prefix_filter(fctkern_t *nk,char *prefix_filter)

{
  size_t sVar1;
  char *dst;
  size_t filter_len;
  char *filter;
  char *prefix_filter_local;
  fctkern_t *nk_local;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x7dd
                  ,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
  }
  if (prefix_filter == (char *)0x0) {
    __assert_fail("prefix_filter != __null && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x7de
                  ,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
  }
  sVar1 = strlen(prefix_filter);
  if (sVar1 == 0) {
    __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x7df
                  ,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
  }
  sVar1 = strlen(prefix_filter);
  dst = (char *)malloc(sVar1 + 1);
  fctstr_safe_cpy(dst,prefix_filter,sVar1 + 1);
  fct_nlist__append(&nk->prefix_list,dst);
  return;
}

Assistant:

static void
fctkern__add_prefix_filter(fctkern_t *nk, char const *prefix_filter)
{
    char *filter =NULL;
    size_t filter_len =0;
    FCT_ASSERT( nk != NULL && "invalid arg" );
    FCT_ASSERT( prefix_filter != NULL && "invalid arg" );
    FCT_ASSERT( strlen(prefix_filter) > 0 && "invalid arg" );
    /* First we make a copy of the prefix, then we store it away
    in our little list. */
    filter_len = strlen(prefix_filter);
    filter = (char*)malloc(sizeof(char)*(filter_len+1));
    fctstr_safe_cpy(filter, prefix_filter, filter_len+1);
    fct_nlist__append(&(nk->prefix_list), (void*)filter);
}